

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall Catch::ConsoleReporter::printOpenHeader(ConsoleReporter *this,string *_name)

{
  ostream *poVar1;
  size_t sVar2;
  Colour colourGuard;
  char local_21;
  
  poVar1 = (this->super_StreamingReporterBase<Catch::ConsoleReporter>).stream;
  if (getLineOfChars<(char)45>()::line == '\0') {
    uRam000000000031b150 = 0x2d2d2d2d2d2d2d;
    uRam000000000031b157._0_1_ = '-';
    uRam000000000031b157._1_1_ = '-';
    uRam000000000031b157._2_1_ = '-';
    uRam000000000031b157._3_1_ = '-';
    uRam000000000031b157._4_1_ = '-';
    uRam000000000031b157._5_1_ = '-';
    uRam000000000031b157._6_1_ = '-';
    uRam000000000031b157._7_1_ = '-';
    DAT_0031b140 = '-';
    DAT_0031b140_1._0_1_ = '-';
    DAT_0031b140_1._1_1_ = '-';
    DAT_0031b140_1._2_1_ = '-';
    DAT_0031b140_1._3_1_ = '-';
    DAT_0031b140_1._4_1_ = '-';
    DAT_0031b140_1._5_1_ = '-';
    DAT_0031b140_1._6_1_ = '-';
    uRam000000000031b148 = 0x2d2d2d2d2d2d2d;
    DAT_0031b14f = 0x2d;
    DAT_0031b130 = '-';
    DAT_0031b130_1._0_1_ = '-';
    DAT_0031b130_1._1_1_ = '-';
    DAT_0031b130_1._2_1_ = '-';
    DAT_0031b130_1._3_1_ = '-';
    DAT_0031b130_1._4_1_ = '-';
    DAT_0031b130_1._5_1_ = '-';
    DAT_0031b130_1._6_1_ = '-';
    uRam000000000031b138._0_1_ = '-';
    uRam000000000031b138._1_1_ = '-';
    uRam000000000031b138._2_1_ = '-';
    uRam000000000031b138._3_1_ = '-';
    uRam000000000031b138._4_1_ = '-';
    uRam000000000031b138._5_1_ = '-';
    uRam000000000031b138._6_1_ = '-';
    uRam000000000031b138._7_1_ = '-';
    DAT_0031b120 = '-';
    DAT_0031b120_1._0_1_ = '-';
    DAT_0031b120_1._1_1_ = '-';
    DAT_0031b120_1._2_1_ = '-';
    DAT_0031b120_1._3_1_ = '-';
    DAT_0031b120_1._4_1_ = '-';
    DAT_0031b120_1._5_1_ = '-';
    DAT_0031b120_1._6_1_ = '-';
    uRam000000000031b128._0_1_ = '-';
    uRam000000000031b128._1_1_ = '-';
    uRam000000000031b128._2_1_ = '-';
    uRam000000000031b128._3_1_ = '-';
    uRam000000000031b128._4_1_ = '-';
    uRam000000000031b128._5_1_ = '-';
    uRam000000000031b128._6_1_ = '-';
    uRam000000000031b128._7_1_ = '-';
    getLineOfChars<(char)45>()::line = '-';
    getLineOfChars<(char)45>()::line_1._0_1_ = '-';
    getLineOfChars<(char)45>()::line_1._1_1_ = '-';
    getLineOfChars<(char)45>()::line_1._2_1_ = '-';
    getLineOfChars<(char)45>()::line_1._3_1_ = '-';
    getLineOfChars<(char)45>()::line_1._4_1_ = '-';
    getLineOfChars<(char)45>()::line_1._5_1_ = '-';
    getLineOfChars<(char)45>()::line_1._6_1_ = '-';
    uRam000000000031b118._0_1_ = '-';
    uRam000000000031b118._1_1_ = '-';
    uRam000000000031b118._2_1_ = '-';
    uRam000000000031b118._3_1_ = '-';
    uRam000000000031b118._4_1_ = '-';
    uRam000000000031b118._5_1_ = '-';
    uRam000000000031b118._6_1_ = '-';
    uRam000000000031b118._7_1_ = '-';
    DAT_0031b15f = 0;
  }
  sVar2 = strlen(&getLineOfChars<(char)45>()::line);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,&getLineOfChars<(char)45>()::line,sVar2)
  ;
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,&local_21,1);
  Colour::use(Headers);
  printHeaderString(this,_name,0);
  Colour::use(None);
  return;
}

Assistant:

void ConsoleReporter::printOpenHeader(std::string const& _name) {
    stream << getLineOfChars<'-'>() << '\n';
    {
        Colour colourGuard(Colour::Headers);
        printHeaderString(_name);
    }
}